

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  float fVar13;
  float fVar18;
  float fVar23;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined4 uVar55;
  long lVar56;
  ulong uVar57;
  long lVar58;
  unsigned_long uVar59;
  undefined4 uVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  undefined1 auVar81 [32];
  undefined1 auVar83 [64];
  float fVar85;
  undefined1 auVar86 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar111 [32];
  size_t local_2f8;
  size_t local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2a8 [32];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar82 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar59 = r->_begin;
  auVar71._8_4_ = 0x7f800000;
  auVar71._0_8_ = 0x7f8000007f800000;
  auVar71._12_4_ = 0x7f800000;
  auVar87 = ZEXT1664(auVar71);
  auVar79._8_4_ = 0xff800000;
  auVar79._0_8_ = 0xff800000ff800000;
  auVar79._12_4_ = 0xff800000;
  auVar82 = ZEXT1664(auVar79);
  local_2f8 = 0;
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  auVar108._8_4_ = 0x5dccb9a2;
  auVar108._0_8_ = 0x5dccb9a25dccb9a2;
  auVar108._12_4_ = 0x5dccb9a2;
  auVar109._8_4_ = 0xddccb9a2;
  auVar109._0_8_ = 0xddccb9a2ddccb9a2;
  auVar109._12_4_ = 0xddccb9a2;
  auVar96 = ZEXT1664(auVar79);
  auVar99 = ZEXT1664(auVar71);
  local_2f0 = k;
  while( true ) {
    if (r->_end <= uVar59) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar99._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar96._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar87._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar82._0_16_;
      __return_storage_ptr__->end = local_2f8;
      return __return_storage_ptr__;
    }
    pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
             vertices.items;
    uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                               super_CurveGeometry.field_0x68 * uVar59);
    uVar57 = (ulong)(uVar5 + 3);
    if (uVar57 < (pBVar6->super_RawBufferView).num) break;
LAB_00bb65b4:
    uVar59 = uVar59 + 1;
  }
  lVar62 = 0;
LAB_00bb6163:
  if ((ulong)((this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar62 + 0x38) {
    pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
    sVar8 = (pBVar6->super_RawBufferView).stride;
    lVar62 = uVar5 * sVar8;
    auVar79 = *(undefined1 (*) [16])(pcVar7 + lVar62);
    lVar64 = (uVar5 + 1) * sVar8;
    auVar71 = *(undefined1 (*) [16])(pcVar7 + lVar64);
    lVar63 = (uVar5 + 2) * sVar8;
    auVar68 = *(undefined1 (*) [16])(pcVar7 + lVar63);
    auVar67 = *(undefined1 (*) [16])(pcVar7 + uVar57 * sVar8);
    fVar4 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
            maxRadiusScale;
    fVar28 = fVar4 * *(float *)(pcVar7 + lVar64 + 0xc);
    fVar29 = fVar4 * *(float *)(pcVar7 + lVar63 + 0xc);
    fVar110 = fVar4 * *(float *)(pcVar7 + uVar57 * sVar8 + 0xc);
    auVar83 = ZEXT464((uint)fVar110);
    uVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
            tessellationRate;
    lVar63 = (long)(int)uVar5;
    auVar72 = vshufps_avx(auVar79,auVar79,0);
    auVar30 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar31 = vshufps_avx(auVar71,auVar71,0);
    auVar65 = vshufps_avx(auVar71,auVar71,0x55);
    auVar32 = vshufps_avx(auVar71,auVar71,0xaa);
    auVar76 = vshufps_avx(auVar68,auVar68,0);
    auVar86 = vshufps_avx(auVar68,auVar68,0x55);
    auVar33 = vshufps_avx(auVar68,auVar68,0xaa);
    auVar80 = vshufps_avx(auVar67,auVar67,0);
    auVar88 = ZEXT1664(auVar80);
    auVar34 = vshufps_avx(auVar67,auVar67,0x55);
    auVar35 = vshufps_avx(auVar67,auVar67,0xaa);
    auVar70 = ZEXT416((uint)fVar110);
    auVar100 = ZEXT416((uint)fVar29);
    auVar98 = ZEXT416((uint)fVar28);
    fVar13 = auVar35._0_4_;
    fVar18 = auVar35._4_4_;
    fVar23 = auVar35._8_4_;
    fVar14 = auVar80._0_4_;
    fVar19 = auVar80._4_4_;
    fVar24 = auVar80._8_4_;
    fVar105 = auVar34._0_4_;
    fVar106 = auVar34._4_4_;
    fVar107 = auVar34._8_4_;
    fVar15 = auVar76._0_4_;
    fVar20 = auVar76._4_4_;
    fVar25 = auVar76._8_4_;
    fVar102 = auVar86._0_4_;
    fVar103 = auVar86._4_4_;
    fVar104 = auVar86._8_4_;
    fVar16 = auVar33._0_4_;
    fVar21 = auVar33._4_4_;
    fVar26 = auVar33._8_4_;
    fVar17 = auVar31._0_4_;
    fVar22 = auVar31._4_4_;
    fVar27 = auVar31._8_4_;
    local_288 = auVar65._0_4_;
    fStack_284 = auVar65._4_4_;
    fStack_280 = auVar65._8_4_;
    fStack_27c = auVar65._12_4_;
    local_268 = auVar32._0_4_;
    fStack_264 = auVar32._4_4_;
    fStack_260 = auVar32._8_4_;
    fStack_25c = auVar32._12_4_;
    local_248 = auVar72._0_4_;
    fStack_244 = auVar72._4_4_;
    fStack_240 = auVar72._8_4_;
    fStack_23c = auVar72._12_4_;
    local_228 = auVar30._0_4_;
    fStack_224 = auVar30._4_4_;
    fStack_220 = auVar30._8_4_;
    fStack_21c = auVar30._12_4_;
    local_2c8._0_4_ = auVar79._0_4_;
    uVar60 = local_2c8._0_4_;
    local_2c8._4_4_ = auVar79._4_4_;
    uVar55 = local_2c8._4_4_;
    fStack_2c0 = auVar79._8_4_;
    fVar112 = fStack_2c0;
    fStack_2bc = auVar79._12_4_;
    fVar113 = fStack_2bc;
    if (lVar63 == 4) {
      auVar67 = vinsertps_avx(auVar67,ZEXT416((uint)fVar110),0x30);
      auVar79 = vshufps_avx(ZEXT416((uint)fVar110),auVar70,0);
      fVar110 = bspline_basis0._2584_4_;
      fVar112 = bspline_basis0._2588_4_;
      fVar113 = bspline_basis0._2592_4_;
      fVar114 = bspline_basis0._2596_4_;
      auVar68 = vinsertps_avx(auVar68,ZEXT416((uint)fVar29),0x30);
      auVar72 = vshufps_avx(ZEXT416((uint)fVar29),auVar100,0);
      auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)fVar28),0x30);
      auVar30 = vshufps_avx(ZEXT416((uint)fVar28),auVar98,0);
      auVar65 = vpermilps_avx(ZEXT416((uint)(fVar4 * *(float *)(pcVar7 + lVar62 + 0xc))),0);
      auVar70._0_4_ =
           (float)bspline_basis0._272_4_ * local_248 +
           (float)bspline_basis0._1428_4_ * fVar17 +
           fVar110 * fVar15 + (float)bspline_basis0._3740_4_ * fVar14;
      auVar70._4_4_ =
           (float)bspline_basis0._276_4_ * fStack_244 +
           (float)bspline_basis0._1432_4_ * fVar22 +
           fVar112 * fVar20 + (float)bspline_basis0._3744_4_ * fVar19;
      auVar70._8_4_ =
           (float)bspline_basis0._280_4_ * fStack_240 +
           (float)bspline_basis0._1436_4_ * fVar27 +
           fVar113 * fVar25 + (float)bspline_basis0._3748_4_ * fVar24;
      auVar70._12_4_ =
           (float)bspline_basis0._284_4_ * fStack_23c +
           (float)bspline_basis0._1440_4_ * auVar31._12_4_ +
           fVar114 * auVar76._12_4_ + (float)bspline_basis0._3752_4_ * auVar80._12_4_;
      auVar80._0_4_ =
           (float)bspline_basis0._272_4_ * local_228 +
           (float)bspline_basis0._1428_4_ * local_288 +
           fVar105 * (float)bspline_basis0._3740_4_ + fVar102 * fVar110;
      auVar80._4_4_ =
           (float)bspline_basis0._276_4_ * fStack_224 +
           (float)bspline_basis0._1432_4_ * fStack_284 +
           fVar106 * (float)bspline_basis0._3744_4_ + fVar103 * fVar112;
      auVar80._8_4_ =
           (float)bspline_basis0._280_4_ * fStack_220 +
           (float)bspline_basis0._1436_4_ * fStack_280 +
           fVar107 * (float)bspline_basis0._3748_4_ + fVar104 * fVar113;
      auVar80._12_4_ =
           (float)bspline_basis0._284_4_ * fStack_21c +
           (float)bspline_basis0._1440_4_ * fStack_27c +
           auVar34._12_4_ * (float)bspline_basis0._3752_4_ + auVar86._12_4_ * fVar114;
      auVar86._0_4_ =
           (float)bspline_basis0._272_4_ * (float)local_2c8._0_4_ +
           (float)bspline_basis0._1428_4_ * local_268 +
           fVar110 * fVar16 + (float)bspline_basis0._3740_4_ * fVar13;
      auVar86._4_4_ =
           (float)bspline_basis0._276_4_ * (float)local_2c8._4_4_ +
           (float)bspline_basis0._1432_4_ * fStack_264 +
           fVar112 * fVar21 + (float)bspline_basis0._3744_4_ * fVar18;
      auVar86._8_4_ =
           (float)bspline_basis0._280_4_ * fStack_2c0 +
           (float)bspline_basis0._1436_4_ * fStack_260 +
           fVar113 * fVar26 + (float)bspline_basis0._3748_4_ * fVar23;
      auVar86._12_4_ =
           (float)bspline_basis0._284_4_ * fStack_2bc +
           (float)bspline_basis0._1440_4_ * fStack_25c +
           fVar114 * auVar33._12_4_ + (float)bspline_basis0._3752_4_ * auVar35._12_4_;
      auVar76._0_4_ =
           auVar65._0_4_ * (float)bspline_basis0._272_4_ +
           (float)bspline_basis0._1428_4_ * auVar30._0_4_ +
           auVar72._0_4_ * fVar110 + (float)bspline_basis0._3740_4_ * auVar79._0_4_;
      auVar76._4_4_ =
           auVar65._4_4_ * (float)bspline_basis0._276_4_ +
           (float)bspline_basis0._1432_4_ * auVar30._4_4_ +
           auVar72._4_4_ * fVar112 + (float)bspline_basis0._3744_4_ * auVar79._4_4_;
      auVar76._8_4_ =
           auVar65._8_4_ * (float)bspline_basis0._280_4_ +
           (float)bspline_basis0._1436_4_ * auVar30._8_4_ +
           auVar72._8_4_ * fVar113 + (float)bspline_basis0._3748_4_ * auVar79._8_4_;
      auVar76._12_4_ =
           auVar65._12_4_ * (float)bspline_basis0._284_4_ +
           (float)bspline_basis0._1440_4_ * auVar30._12_4_ +
           auVar72._12_4_ * fVar114 + (float)bspline_basis0._3752_4_ * auVar79._12_4_;
      auVar31 = vshufps_avx(auVar70,auVar70,0xb1);
      auVar79 = vminps_avx(auVar31,auVar70);
      auVar72 = vshufpd_avx(auVar79,auVar79,1);
      auVar79 = vminps_avx(auVar72,auVar79);
      auVar65 = vshufps_avx(auVar80,auVar80,0xb1);
      auVar72 = vminps_avx(auVar65,auVar80);
      auVar30 = vshufpd_avx(auVar72,auVar72,1);
      auVar72 = vminps_avx(auVar30,auVar72);
      auVar79 = vinsertps_avx(auVar79,auVar72,0x1c);
      auVar32 = vshufps_avx(auVar86,auVar86,0xb1);
      auVar72 = vminps_avx(auVar32,auVar86);
      auVar30 = vshufpd_avx(auVar72,auVar72,1);
      auVar72 = vminps_avx(auVar30,auVar72);
      auVar72 = vinsertps_avx(auVar79,auVar72,0x20);
      auVar79 = vmaxps_avx(auVar31,auVar70);
      auVar30 = vshufpd_avx(auVar79,auVar79,1);
      auVar79 = vmaxps_avx(auVar30,auVar79);
      auVar30 = vmaxps_avx(auVar65,auVar80);
      auVar31 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vmaxps_avx(auVar31,auVar30);
      auVar79 = vinsertps_avx(auVar79,auVar30,0x1c);
      auVar30 = vmaxps_avx(auVar32,auVar86);
      auVar31 = vshufpd_avx(auVar30,auVar30,1);
      auVar30 = vmaxps_avx(auVar31,auVar30);
      auVar30 = vinsertps_avx(auVar79,auVar30,0x20);
      auVar79 = vandps_avx(auVar76,auVar75);
      auVar31 = vshufps_avx(auVar79,auVar79,0xb1);
      auVar79 = vmaxps_avx(auVar31,auVar79);
      auVar31 = vshufps_avx(auVar79,auVar79,0);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar31 = vmaxps_avx(auVar79,auVar31);
      local_2e8 = auVar67._0_4_;
      fStack_2e4 = auVar67._4_4_;
      fStack_2e0 = auVar67._8_4_;
      fStack_2dc = auVar67._12_4_;
      auVar65._0_4_ =
           auVar71._0_4_ * 0.16666667 + auVar68._0_4_ * 0.6666667 + local_2e8 * 0.16666667;
      auVar65._4_4_ =
           auVar71._4_4_ * 0.16666667 + auVar68._4_4_ * 0.6666667 + fStack_2e4 * 0.16666667;
      auVar65._8_4_ =
           auVar71._8_4_ * 0.16666667 + auVar68._8_4_ * 0.6666667 + fStack_2e0 * 0.16666667;
      auVar65._12_4_ =
           auVar71._12_4_ * 0.16666667 + auVar68._12_4_ * 0.6666667 + fStack_2dc * 0.16666667;
      auVar67 = vminps_avx(auVar72,auVar65);
      auVar71 = vmaxps_avx(auVar30,auVar65);
      auVar79 = vshufps_avx(auVar65,auVar65,0xff);
      auVar79 = vandps_avx(auVar79,auVar75);
      auVar68 = vmaxps_avx(auVar31,auVar79);
      auVar79 = vsubps_avx(auVar67,auVar68);
      auVar67._0_4_ = auVar71._0_4_ + auVar68._0_4_;
      auVar67._4_4_ = auVar71._4_4_ + auVar68._4_4_;
      auVar67._8_4_ = auVar71._8_4_ + auVar68._8_4_;
      auVar67._12_4_ = auVar71._12_4_ + auVar68._12_4_;
    }
    else {
      auVar79 = vpshufd_avx(ZEXT416(uVar5),0);
      auVar72 = vpermilps_avx(ZEXT416((uint)(fVar4 * *(float *)(pcVar7 + lVar62 + 0xc))),0);
      auVar77._16_16_ = auVar72;
      auVar77._0_16_ = auVar72;
      auVar71 = vshufps_avx(auVar98,auVar98,0);
      auVar68 = vshufps_avx(auVar100,auVar100,0);
      auVar67 = vshufps_avx(auVar70,auVar70,0);
      lVar62 = lVar63 * 0x44;
      auVar97 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar111._8_4_ = 0xff800000;
      auVar111._0_8_ = 0xff800000ff800000;
      auVar111._12_4_ = 0xff800000;
      auVar111._16_4_ = 0xff800000;
      auVar111._20_4_ = 0xff800000;
      auVar111._24_4_ = 0xff800000;
      auVar111._28_4_ = 0xff800000;
      auVar101._8_4_ = 0x7f800000;
      auVar101._0_8_ = 0x7f8000007f800000;
      auVar101._12_4_ = 0x7f800000;
      auVar101._16_4_ = 0x7f800000;
      auVar101._20_4_ = 0x7f800000;
      auVar101._24_4_ = 0x7f800000;
      auVar101._28_4_ = 0x7f800000;
      auVar9 = auVar111;
      auVar10 = auVar111;
      _local_2c8 = auVar101;
      local_2a8 = auVar101;
      for (lVar64 = 0; auVar95 = auVar97._0_32_, lVar64 <= lVar63; lVar64 = lVar64 + 8) {
        auVar65 = vpshufd_avx(ZEXT416((uint)lVar64),0);
        auVar30 = vpor_avx(auVar65,_DAT_01f4ad30);
        auVar65 = vpor_avx(auVar65,_DAT_01f7afa0);
        auVar30 = vpcmpgtd_avx(auVar30,auVar79);
        auVar65 = vpcmpgtd_avx(auVar65,auVar79);
        auVar66._16_16_ = auVar65;
        auVar66._0_16_ = auVar30;
        pfVar1 = (float *)(lVar62 + 0x2200430 + lVar64 * 4);
        fVar29 = *pfVar1;
        fVar110 = pfVar1[1];
        fVar114 = pfVar1[2];
        fVar36 = pfVar1[3];
        fVar37 = pfVar1[4];
        fVar38 = pfVar1[5];
        fVar39 = pfVar1[6];
        pfVar2 = (float *)(lVar62 + 0x22008b4 + lVar64 * 4);
        fVar40 = *pfVar2;
        fVar41 = pfVar2[1];
        fVar42 = pfVar2[2];
        fVar43 = pfVar2[3];
        fVar44 = pfVar2[4];
        fVar45 = pfVar2[5];
        fVar46 = pfVar2[6];
        fVar28 = auVar9._28_4_;
        fVar78 = fVar28 + auVar77._28_4_;
        fVar84 = fVar28 + auVar83._28_4_;
        fVar4 = auVar88._28_4_;
        pfVar3 = (float *)(lVar62 + 0x21fffac + lVar64 * 4);
        fVar47 = *pfVar3;
        fVar48 = pfVar3[1];
        fVar49 = pfVar3[2];
        fVar50 = pfVar3[3];
        fVar51 = pfVar3[4];
        fVar52 = pfVar3[5];
        fVar53 = pfVar3[6];
        fVar54 = pfVar3[7];
        local_1b8 = auVar67._0_4_;
        fStack_1b4 = auVar67._4_4_;
        fStack_1b0 = auVar67._8_4_;
        fStack_1ac = auVar67._12_4_;
        local_138 = auVar68._0_4_;
        fStack_134 = auVar68._4_4_;
        fStack_130 = auVar68._8_4_;
        fStack_12c = auVar68._12_4_;
        auVar77 = *(undefined1 (*) [32])(bspline_basis0 + lVar64 * 4 + lVar62);
        auVar88 = ZEXT3264(auVar77);
        local_b8 = auVar71._0_4_;
        fStack_b4 = auVar71._4_4_;
        fStack_b0 = auVar71._8_4_;
        fStack_ac = auVar71._12_4_;
        fVar85 = auVar77._0_4_;
        fVar89 = auVar77._4_4_;
        fVar90 = auVar77._8_4_;
        fVar91 = auVar77._12_4_;
        fVar92 = auVar77._16_4_;
        fVar93 = auVar77._20_4_;
        fVar94 = auVar77._24_4_;
        auVar73._0_4_ = fVar85 * local_248 + fVar47 * fVar17 + fVar29 * fVar15 + fVar40 * fVar14;
        auVar73._4_4_ = fVar89 * fStack_244 + fVar48 * fVar22 + fVar110 * fVar20 + fVar41 * fVar19;
        auVar73._8_4_ = fVar90 * fStack_240 + fVar49 * fVar27 + fVar114 * fVar25 + fVar42 * fVar24;
        auVar73._12_4_ =
             fVar91 * fStack_23c +
             fVar50 * auVar31._12_4_ + fVar36 * auVar76._12_4_ + fVar43 * auVar80._12_4_;
        auVar73._16_4_ = fVar92 * local_248 + fVar51 * fVar17 + fVar37 * fVar15 + fVar44 * fVar14;
        auVar73._20_4_ = fVar93 * fStack_244 + fVar52 * fVar22 + fVar38 * fVar20 + fVar45 * fVar19;
        auVar73._24_4_ = fVar94 * fStack_240 + fVar53 * fVar27 + fVar39 * fVar25 + fVar46 * fVar24;
        auVar73._28_4_ = fVar54 + pfVar2[7] + fVar78;
        auVar77._0_4_ =
             fVar85 * local_228 + fVar47 * local_288 + fVar29 * fVar102 + fVar40 * fVar105;
        auVar77._4_4_ =
             fVar89 * fStack_224 + fVar48 * fStack_284 + fVar110 * fVar103 + fVar41 * fVar106;
        auVar77._8_4_ =
             fVar90 * fStack_220 + fVar49 * fStack_280 + fVar114 * fVar104 + fVar42 * fVar107;
        auVar77._12_4_ =
             fVar91 * fStack_21c +
             fVar50 * fStack_27c + fVar36 * auVar86._12_4_ + fVar43 * auVar34._12_4_;
        auVar77._16_4_ =
             fVar92 * local_228 + fVar51 * local_288 + fVar37 * fVar102 + fVar44 * fVar105;
        auVar77._20_4_ =
             fVar93 * fStack_224 + fVar52 * fStack_284 + fVar38 * fVar103 + fVar45 * fVar106;
        auVar77._24_4_ =
             fVar94 * fStack_220 + fVar53 * fStack_280 + fVar39 * fVar104 + fVar46 * fVar107;
        auVar77._28_4_ = fVar54 + fVar78 + fVar84;
        auVar74 = vminps_avx(auVar101,auVar73);
        auVar101 = vblendvps_avx(auVar74,auVar101,auVar66);
        auVar74 = vminps_avx(_local_2c8,auVar77);
        _local_2c8 = vblendvps_avx(auVar74,_local_2c8,auVar66);
        auVar81._0_4_ =
             fVar85 * (float)uVar60 + fVar47 * local_268 + fVar29 * fVar16 + fVar40 * fVar13;
        auVar81._4_4_ =
             fVar89 * (float)uVar55 + fVar48 * fStack_264 + fVar110 * fVar21 + fVar41 * fVar18;
        auVar81._8_4_ = fVar90 * fVar112 + fVar49 * fStack_260 + fVar114 * fVar26 + fVar42 * fVar23;
        auVar81._12_4_ =
             fVar91 * fVar113 +
             fVar50 * fStack_25c + fVar36 * auVar33._12_4_ + fVar43 * auVar35._12_4_;
        auVar81._16_4_ =
             fVar92 * (float)uVar60 + fVar51 * local_268 + fVar37 * fVar16 + fVar44 * fVar13;
        auVar81._20_4_ =
             fVar93 * (float)uVar55 + fVar52 * fStack_264 + fVar38 * fVar21 + fVar45 * fVar18;
        auVar81._24_4_ = fVar94 * fVar112 + fVar53 * fStack_260 + fVar39 * fVar26 + fVar46 * fVar23;
        auVar81._28_4_ = auVar74._28_4_ + fVar84 + fVar28 + fVar4;
        auVar83 = ZEXT3264(auVar81);
        auVar74 = vminps_avx(local_2a8,auVar81);
        local_2a8 = vblendvps_avx(auVar74,local_2a8,auVar66);
        auVar74 = vmaxps_avx(auVar9,auVar73);
        auVar9 = vblendvps_avx(auVar74,auVar9,auVar66);
        local_78 = auVar72._0_4_;
        fStack_74 = auVar72._4_4_;
        fStack_70 = auVar72._8_4_;
        fStack_6c = auVar72._12_4_;
        auVar69._0_4_ =
             fVar85 * local_78 + fVar47 * local_b8 + fVar29 * local_138 + fVar40 * local_1b8;
        auVar69._4_4_ =
             fVar89 * fStack_74 + fVar48 * fStack_b4 + fVar110 * fStack_134 + fVar41 * fStack_1b4;
        auVar69._8_4_ =
             fVar90 * fStack_70 + fVar49 * fStack_b0 + fVar114 * fStack_130 + fVar42 * fStack_1b0;
        auVar69._12_4_ =
             fVar91 * fStack_6c + fVar50 * fStack_ac + fVar36 * fStack_12c + fVar43 * fStack_1ac;
        auVar69._16_4_ =
             fVar92 * local_78 + fVar51 * local_b8 + fVar37 * local_138 + fVar44 * local_1b8;
        auVar69._20_4_ =
             fVar93 * fStack_74 + fVar52 * fStack_b4 + fVar38 * fStack_134 + fVar45 * fStack_1b4;
        auVar69._24_4_ =
             fVar94 * fStack_70 + fVar53 * fStack_b0 + fVar39 * fStack_130 + fVar46 * fStack_1b0;
        auVar69._28_4_ = auVar74._28_4_ + fVar54 + pfVar1[7] + pfVar2[7];
        auVar74 = vmaxps_avx(auVar111,auVar77);
        auVar111 = vblendvps_avx(auVar74,auVar111,auVar66);
        auVar74 = vmaxps_avx(auVar10,auVar81);
        auVar10 = vblendvps_avx(auVar74,auVar10,auVar66);
        auVar74._8_4_ = 0x7fffffff;
        auVar74._0_8_ = 0x7fffffff7fffffff;
        auVar74._12_4_ = 0x7fffffff;
        auVar74._16_4_ = 0x7fffffff;
        auVar74._20_4_ = 0x7fffffff;
        auVar74._24_4_ = 0x7fffffff;
        auVar74._28_4_ = 0x7fffffff;
        auVar74 = vandps_avx(auVar69,auVar74);
        auVar74 = vmaxps_avx(auVar95,auVar74);
        auVar95 = vblendvps_avx(auVar74,auVar95,auVar66);
        auVar97 = ZEXT3264(auVar95);
      }
      auVar77 = vshufps_avx(auVar101,auVar101,0xb1);
      auVar101 = vminps_avx(auVar101,auVar77);
      auVar77 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vminps_avx(auVar101,auVar77);
      auVar79 = vminps_avx(auVar101._0_16_,auVar101._16_16_);
      auVar101 = vshufps_avx(_local_2c8,_local_2c8,0xb1);
      auVar101 = vminps_avx(_local_2c8,auVar101);
      auVar77 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vminps_avx(auVar101,auVar77);
      auVar71 = vminps_avx(auVar101._0_16_,auVar101._16_16_);
      auVar71 = vunpcklps_avx(auVar79,auVar71);
      auVar101 = vshufps_avx(local_2a8,local_2a8,0xb1);
      auVar101 = vminps_avx(local_2a8,auVar101);
      auVar77 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vminps_avx(auVar101,auVar77);
      auVar79 = vminps_avx(auVar101._0_16_,auVar101._16_16_);
      auVar79 = vinsertps_avx(auVar71,auVar79,0x28);
      auVar101 = vshufps_avx(auVar9,auVar9,0xb1);
      auVar101 = vmaxps_avx(auVar9,auVar101);
      auVar9 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vmaxps_avx(auVar101,auVar9);
      auVar71 = vmaxps_avx(auVar101._0_16_,auVar101._16_16_);
      auVar101 = vshufps_avx(auVar111,auVar111,0xb1);
      auVar101 = vmaxps_avx(auVar111,auVar101);
      auVar9 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vmaxps_avx(auVar101,auVar9);
      auVar68 = vmaxps_avx(auVar101._0_16_,auVar101._16_16_);
      auVar68 = vunpcklps_avx(auVar71,auVar68);
      auVar101 = vshufps_avx(auVar10,auVar10,0xb1);
      auVar101 = vmaxps_avx(auVar10,auVar101);
      auVar9 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vmaxps_avx(auVar101,auVar9);
      auVar71 = vmaxps_avx(auVar101._0_16_,auVar101._16_16_);
      auVar71 = vinsertps_avx(auVar68,auVar71,0x28);
      auVar101 = vshufps_avx(auVar95,auVar95,0xb1);
      auVar101 = vmaxps_avx(auVar95,auVar101);
      auVar9 = vshufpd_avx(auVar101,auVar101,5);
      auVar101 = vmaxps_avx(auVar101,auVar9);
      auVar68 = vmaxps_avx(auVar101._0_16_,auVar101._16_16_);
      auVar68 = vshufps_avx(auVar68,auVar68,0);
      auVar79 = vsubps_avx(auVar79,auVar68);
      auVar67._0_4_ = auVar71._0_4_ + auVar68._0_4_;
      auVar67._4_4_ = auVar71._4_4_ + auVar68._4_4_;
      auVar67._8_4_ = auVar71._8_4_ + auVar68._8_4_;
      auVar67._12_4_ = auVar71._12_4_ + auVar68._12_4_;
    }
    auVar71 = vandps_avx(auVar79,auVar75);
    auVar68 = vandps_avx(auVar67,auVar75);
    auVar71 = vmaxps_avx(auVar71,auVar68);
    auVar68 = vmovshdup_avx(auVar71);
    auVar68 = vmaxss_avx(auVar68,auVar71);
    auVar71 = vshufpd_avx(auVar71,auVar71,1);
    auVar71 = vmaxss_avx(auVar71,auVar68);
    auVar71 = ZEXT416((uint)(auVar71._0_4_ * 4.7683716e-07));
    auVar71 = vshufps_avx(auVar71,auVar71,0);
    auVar79 = vsubps_avx(auVar79,auVar71);
    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar79,ZEXT416(geomID),0x30);
    auVar68._0_4_ = auVar67._0_4_ + auVar71._0_4_;
    auVar68._4_4_ = auVar67._4_4_ + auVar71._4_4_;
    auVar68._8_4_ = auVar67._8_4_ + auVar71._8_4_;
    auVar68._12_4_ = auVar67._12_4_ + auVar71._12_4_;
    aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar68,ZEXT416((uint)uVar59),0x30);
    auVar79 = vminps_avx((undefined1  [16])auVar99._0_16_,(undefined1  [16])aVar11);
    auVar99 = ZEXT1664(auVar79);
    auVar79 = vmaxps_avx((undefined1  [16])auVar96._0_16_,(undefined1  [16])aVar12);
    auVar96 = ZEXT1664(auVar79);
    auVar72._0_4_ = aVar11.x + aVar12.x;
    auVar72._4_4_ = aVar11.y + aVar12.y;
    auVar72._8_4_ = aVar11.z + aVar12.z;
    auVar72._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
    auVar79 = vminps_avx((undefined1  [16])auVar87._0_16_,auVar72);
    auVar87 = ZEXT1664(auVar79);
    auVar79 = vmaxps_avx((undefined1  [16])auVar82._0_16_,auVar72);
    auVar82 = ZEXT1664(auVar79);
    local_2f8 = local_2f8 + 1;
    prims[local_2f0].upper.field_0.field_1 = aVar12;
    prims[local_2f0].lower.field_0.field_1 = aVar11;
    local_2f0 = local_2f0 + 1;
  }
  else {
    lVar63 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar62);
    lVar64 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar62);
    lVar61 = lVar64 * (ulong)uVar5;
    lVar56 = lVar64 * (ulong)(uVar5 + 1);
    lVar58 = lVar64 * (ulong)(uVar5 + 2);
    auVar79 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + 0xc + lVar61)),
                            ZEXT416(*(uint *)(lVar63 + 0xc + lVar56)),0x10);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(lVar63 + 0xc + lVar58)),0x20);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(lVar63 + 0xc + lVar64 * uVar57)),0x30);
    auVar79 = vandps_avx(auVar79,auVar75);
    auVar79 = vcmpps_avx(auVar79,auVar108,5);
    if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar79[0xf]) {
      auVar79 = *(undefined1 (*) [16])(lVar63 + lVar61);
      auVar71 = vcmpps_avx(auVar79,auVar109,6);
      auVar79 = vcmpps_avx(auVar79,auVar108,1);
      auVar79 = vandps_avx(auVar71,auVar79);
      uVar60 = vmovmskps_avx(auVar79);
      if ((~(byte)uVar60 & 7) == 0) {
        auVar79 = *(undefined1 (*) [16])(lVar63 + lVar56);
        auVar71 = vcmpps_avx(auVar79,auVar109,6);
        auVar79 = vcmpps_avx(auVar79,auVar108,1);
        auVar79 = vandps_avx(auVar71,auVar79);
        uVar60 = vmovmskps_avx(auVar79);
        if ((~(byte)uVar60 & 7) == 0) {
          auVar79 = *(undefined1 (*) [16])(lVar63 + lVar58);
          auVar71 = vcmpps_avx(auVar79,auVar109,6);
          auVar79 = vcmpps_avx(auVar79,auVar108,1);
          auVar79 = vandps_avx(auVar71,auVar79);
          uVar60 = vmovmskps_avx(auVar79);
          if ((~(byte)uVar60 & 7) == 0) goto code_r0x00bb6246;
        }
      }
    }
  }
  goto LAB_00bb65b4;
code_r0x00bb6246:
  auVar79 = *(undefined1 (*) [16])(lVar63 + lVar64 * uVar57);
  auVar71 = vcmpps_avx(auVar79,auVar109,6);
  auVar79 = vcmpps_avx(auVar79,auVar108,1);
  auVar79 = vandps_avx(auVar71,auVar79);
  uVar60 = vmovmskps_avx(auVar79);
  lVar62 = lVar62 + 0x38;
  if ((~(byte)uVar60 & 7) != 0) goto LAB_00bb65b4;
  goto LAB_00bb6163;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }